

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_charRefNumber(ENCODING *enc,char *ptr)

{
  char *pcVar1;
  uint result;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((ptr[5] == '\0') && (ptr[4] == 'x')) {
    pcVar1 = ptr + 7;
    result = 0;
    do {
      if (*pcVar1 == '\0') {
        iVar2 = (int)pcVar1[-1];
        if (iVar2 == 0x3b) goto LAB_005192fe;
        uVar3 = (byte)pcVar1[-1] - 0x30;
        uVar4 = (ulong)uVar3;
        if (uVar3 < 0x37) {
          if ((0x3ffUL >> (uVar4 & 0x3f) & 1) == 0) {
            if ((0x7e0000UL >> (uVar4 & 0x3f) & 1) == 0) {
              if ((0x7e000000000000U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_005192c7;
              result = (result * 0x10 + iVar2) - 0x57;
            }
            else {
              result = (result * 0x10 + iVar2) - 0x37;
            }
          }
          else {
            result = result << 4 | iVar2 - 0x30U;
          }
          if (0x10ffff < (int)result) {
            return -1;
          }
        }
      }
LAB_005192c7:
      pcVar1 = pcVar1 + 2;
    } while( true );
  }
  pcVar1 = ptr + 5;
  result = 0;
  do {
    iVar2 = -0x31;
    if (*pcVar1 == '\0') {
      if (pcVar1[-1] == 0x3b) {
LAB_005192fe:
        iVar2 = checkCharRefNumber(result);
        return iVar2;
      }
      iVar2 = pcVar1[-1] + -0x30;
    }
    result = result * 10 + iVar2;
    pcVar1 = pcVar1 + 2;
    if (0x10ffff < (int)result) {
      return -1;
    }
  } while( true );
}

Assistant:

PREFIX(charRefNumber)(const ENCODING *enc, const char *ptr) {
  int result = 0;
  /* skip &# */
  UNUSED_P(enc);
  ptr += 2 * MINBPC(enc);
  if (CHAR_MATCHES(enc, ptr, ASCII_x)) {
    for (ptr += MINBPC(enc); ! CHAR_MATCHES(enc, ptr, ASCII_SEMI);
         ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      switch (c) {
      case ASCII_0:
      case ASCII_1:
      case ASCII_2:
      case ASCII_3:
      case ASCII_4:
      case ASCII_5:
      case ASCII_6:
      case ASCII_7:
      case ASCII_8:
      case ASCII_9:
        result <<= 4;
        result |= (c - ASCII_0);
        break;
      case ASCII_A:
      case ASCII_B:
      case ASCII_C:
      case ASCII_D:
      case ASCII_E:
      case ASCII_F:
        result <<= 4;
        result += 10 + (c - ASCII_A);
        break;
      case ASCII_a:
      case ASCII_b:
      case ASCII_c:
      case ASCII_d:
      case ASCII_e:
      case ASCII_f:
        result <<= 4;
        result += 10 + (c - ASCII_a);
        break;
      }
      if (result >= 0x110000)
        return -1;
    }
  } else {
    for (; ! CHAR_MATCHES(enc, ptr, ASCII_SEMI); ptr += MINBPC(enc)) {
      int c = BYTE_TO_ASCII(enc, ptr);
      result *= 10;
      result += (c - ASCII_0);
      if (result >= 0x110000)
        return -1;
    }
  }
  return checkCharRefNumber(result);
}